

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfilesystemmodel.cpp
# Opt level: O3

bool __thiscall
QFileSystemModelPrivate::passNameFilters(QFileSystemModelPrivate *this,QFileSystemNode *node)

{
  Data *pDVar1;
  QRegularExpressionMatch *pQVar2;
  char cVar3;
  Type TVar4;
  anon_class_8_1_898f5b00_for__M_pred matchesNodeFileName;
  long lVar5;
  long lVar6;
  QRegularExpressionMatch *pQVar7;
  QRegularExpressionMatch *pQVar8;
  
  if ((this->nameFilters).d.size == 0) {
    return true;
  }
  if (node->info == (QExtendedInformation *)0x0) {
    pDVar1 = (node->children).d;
    if ((pDVar1 != (Data *)0x0) && (0 < (long)pDVar1->size)) goto LAB_00613026;
  }
  else {
    TVar4 = QExtendedInformation::type(node->info);
    if (TVar4 == Dir) {
LAB_00613026:
      if (((this->filters).super_QFlagsStorageHelper<QDir::Filter,_4>.
           super_QFlagsStorage<QDir::Filter>.i & 0x400) != 0) {
        return true;
      }
    }
  }
  pQVar7 = (QRegularExpressionMatch *)
           (this->nameFiltersRegexps).
           super__Vector_base<QRegularExpression,_std::allocator<QRegularExpression>_>._M_impl.
           super__Vector_impl_data._M_start;
  pQVar2 = (QRegularExpressionMatch *)
           (this->nameFiltersRegexps).
           super__Vector_base<QRegularExpression,_std::allocator<QRegularExpression>_>._M_impl.
           super__Vector_impl_data._M_finish;
  lVar6 = (long)pQVar2 - (long)pQVar7;
  if (0 < lVar6 >> 5) {
    lVar5 = (lVar6 >> 5) + 1;
    do {
      cVar3 = QString::contains((QRegularExpression *)node,pQVar7);
      pQVar8 = pQVar7;
      if (cVar3 != '\0') goto LAB_00613119;
      cVar3 = QString::contains((QRegularExpression *)node,pQVar7 + 8);
      pQVar8 = pQVar7 + 8;
      if (cVar3 != '\0') goto LAB_00613119;
      cVar3 = QString::contains((QRegularExpression *)node,pQVar7 + 0x10);
      pQVar8 = pQVar7 + 0x10;
      if (cVar3 != '\0') goto LAB_00613119;
      cVar3 = QString::contains((QRegularExpression *)node,pQVar7 + 0x18);
      pQVar8 = pQVar7 + 0x18;
      if (cVar3 != '\0') goto LAB_00613119;
      pQVar7 = pQVar7 + 0x20;
      lVar5 = lVar5 + -1;
      lVar6 = lVar6 + -0x20;
    } while (1 < lVar5);
  }
  lVar6 = lVar6 >> 3;
  if (lVar6 != 1) {
    if (lVar6 != 2) {
      pQVar8 = pQVar2;
      if ((lVar6 != 3) ||
         (cVar3 = QString::contains((QRegularExpression *)node,pQVar7), pQVar8 = pQVar7,
         cVar3 != '\0')) goto LAB_00613119;
      pQVar7 = pQVar7 + 8;
    }
    cVar3 = QString::contains((QRegularExpression *)node,pQVar7);
    pQVar8 = pQVar7;
    if (cVar3 != '\0') goto LAB_00613119;
    pQVar7 = pQVar7 + 8;
  }
  cVar3 = QString::contains((QRegularExpression *)node,pQVar7);
  pQVar8 = pQVar7;
  if (cVar3 == '\0') {
    pQVar8 = pQVar2;
  }
LAB_00613119:
  return pQVar8 != pQVar2;
}

Assistant:

bool QFileSystemModelPrivate::passNameFilters(const QFileSystemNode *node) const
{
#if QT_CONFIG(regularexpression)
    if (nameFilters.isEmpty())
        return true;

    // Check the name regularexpression filters
    if (!(node->isDir() && (filters & QDir::AllDirs))) {
        const auto matchesNodeFileName = [node](const QRegularExpression &re)
        {
            return node->fileName.contains(re);
        };
        return std::any_of(nameFiltersRegexps.begin(),
                           nameFiltersRegexps.end(),
                           matchesNodeFileName);
    }
#else
    Q_UNUSED(node);
#endif
    return true;
}